

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::layoutChildren
          (AbstractScrollAreaPrivate *this,QStyleOption *opt)

{
  QRect *pQVar1;
  BlurEffect *pBVar2;
  int iVar3;
  QRect local_38;
  
  local_38 = (QRect)QWidget::contentsRect();
  iVar3 = QWidget::layoutDirection();
  local_38.y2 = local_38.y2 - this->bottom;
  pQVar1 = (QRect *)this->viewport;
  local_38.x2 = local_38.x2 - (&this->right)[iVar3 == 1];
  local_38.x1 = local_38.x1 + (&this->right)[iVar3 != 1];
  local_38.y1 = local_38.y1 + this->top;
  QStyle::visualRect(*(LayoutDirection *)(opt + 0xc),(QRect *)(opt + 0x10),&local_38);
  QWidget::setGeometry(pQVar1);
  pBVar2 = this->horBlur;
  (**(code **)((long)*(QSize *)pBVar2 + 0x70))(pBVar2);
  QWidget::resize((QSize *)pBVar2);
  pBVar2 = this->vertBlur;
  (**(code **)((long)*(QSize *)pBVar2 + 0x70))(pBVar2);
  QWidget::resize((QSize *)pBVar2);
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::layoutChildren( const QStyleOption & opt )
{
	QRect viewportRect = q->contentsRect();

	if( q->isRightToLeft() )
		viewportRect.adjust( right, top, -left, -bottom );
	else
		viewportRect.adjust( left, top, -right, -bottom );

	viewport->setGeometry( QStyle::visualRect( opt.direction, opt.rect,
		viewportRect ) );

	horBlur->resize( horBlur->sizeHint().width(),
		viewportRect.height() * 0.75 );

	vertBlur->resize( viewportRect.width() * 0.75,
		vertBlur->sizeHint().height() );
}